

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_number_table.cpp
# Opt level: O1

void __thiscall
spvtools::opt::ValueNumberTable::BuildDominatorTreeValueNumberTable(ValueNumberTable *this)

{
  Module *pMVar1;
  pointer puVar2;
  __uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
  _Var3;
  long *plVar4;
  long lVar5;
  uint32_t uVar6;
  long *plVar7;
  Instruction *inst;
  Instruction *pIVar8;
  pointer puVar9;
  
  pMVar1 = (this->context_->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  for (pIVar8 = *(Instruction **)
                 ((long)&(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction> +
                 0x10);
      pIVar8 != (Instruction *)
                ((long)&(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)
      ; pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
    if ((pIVar8->has_result_id_ == true) &&
       (uVar6 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_), uVar6 != 0)) {
      AssignValueNumber(this,pIVar8);
    }
  }
  pMVar1 = (this->context_->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  for (pIVar8 = *(Instruction **)
                 ((long)&(pMVar1->capabilities_).super_IntrusiveList<spvtools::opt::Instruction> +
                 0x10);
      pIVar8 != (Instruction *)
                ((long)&(pMVar1->capabilities_).super_IntrusiveList<spvtools::opt::Instruction> + 8U
                ); pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_
      ) {
    if ((pIVar8->has_result_id_ == true) &&
       (uVar6 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_), uVar6 != 0)) {
      AssignValueNumber(this,pIVar8);
    }
  }
  pMVar1 = (this->context_->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  for (pIVar8 = *(Instruction **)
                 ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> +
                 0x10);
      pIVar8 != (Instruction *)
                ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 8U
                ); pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_
      ) {
    if ((pIVar8->has_result_id_ == true) &&
       (uVar6 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_), uVar6 != 0)) {
      AssignValueNumber(this,pIVar8);
    }
  }
  pMVar1 = (this->context_->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  for (pIVar8 = *(Instruction **)
                 ((long)&(pMVar1->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>
                 + 0x10);
      pIVar8 != (Instruction *)
                ((long)&(pMVar1->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>
                + 8U);
      pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
    if ((pIVar8->has_result_id_ == true) &&
       (uVar6 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_), uVar6 != 0)) {
      AssignValueNumber(this,pIVar8);
    }
  }
  pMVar1 = (this->context_->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  for (pIVar8 = *(Instruction **)
                 ((long)&(pMVar1->ext_inst_debuginfo_).
                         super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
      pIVar8 != (Instruction *)
                ((long)&(pMVar1->ext_inst_debuginfo_).
                        super_IntrusiveList<spvtools::opt::Instruction> + 8U);
      pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
    if ((pIVar8->has_result_id_ == true) &&
       (uVar6 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_), uVar6 != 0)) {
      AssignValueNumber(this,pIVar8);
    }
  }
  pMVar1 = (this->context_->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  puVar2 = *(pointer *)
            ((long)&(pMVar1->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
            + 8);
  for (puVar9 = *(pointer *)
                 &(pMVar1->functions_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                  ._M_impl; puVar9 != puVar2; puVar9 = puVar9 + 1) {
    _Var3.
    super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
    _M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
    .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl =
         (puVar9->_M_t).
         super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
    ;
    plVar4 = *(long **)((long)_Var3.
                              super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                              .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl
                       + 0xa0);
    for (plVar7 = *(long **)((long)_Var3.
                                   super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                                   .super__Head_base<0UL,_spvtools::opt::Function_*,_false>.
                                   _M_head_impl + 0x98); plVar7 != plVar4; plVar7 = plVar7 + 1) {
      lVar5 = *plVar7;
      for (pIVar8 = *(Instruction **)(lVar5 + 0x20); pIVar8 != (Instruction *)(lVar5 + 0x18);
          pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        if ((pIVar8->has_result_id_ == true) &&
           (uVar6 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_), uVar6 != 0
           )) {
          AssignValueNumber(this,pIVar8);
        }
      }
    }
  }
  return;
}

Assistant:

void ValueNumberTable::BuildDominatorTreeValueNumberTable() {
  // First value number the headers.
  for (auto& inst : context()->annotations()) {
    if (inst.result_id() != 0) {
      AssignValueNumber(&inst);
    }
  }

  for (auto& inst : context()->capabilities()) {
    if (inst.result_id() != 0) {
      AssignValueNumber(&inst);
    }
  }

  for (auto& inst : context()->types_values()) {
    if (inst.result_id() != 0) {
      AssignValueNumber(&inst);
    }
  }

  for (auto& inst : context()->module()->ext_inst_imports()) {
    if (inst.result_id() != 0) {
      AssignValueNumber(&inst);
    }
  }

  for (auto& inst : context()->module()->ext_inst_debuginfo()) {
    if (inst.result_id() != 0) {
      AssignValueNumber(&inst);
    }
  }

  for (Function& func : *context()->module()) {
    // For best results we want to traverse the code in reverse post order.
    // This happens naturally because of the forward referencing rules.
    for (BasicBlock& block : func) {
      for (Instruction& inst : block) {
        if (inst.result_id() != 0) {
          AssignValueNumber(&inst);
        }
      }
    }
  }
}